

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s2;
  char *__s1;
  long lVar1;
  int iVar2;
  command_t *pcVar3;
  long lVar4;
  bool bVar5;
  
  if (argc < 2) {
    help_main(argc,argv);
  }
  else {
    __s2 = argv[1];
    iVar2 = strcmp("copyall",__s2);
    if (iVar2 == 0) {
      pcVar3 = commands;
      bVar5 = false;
    }
    else {
      lVar1 = 0;
      do {
        lVar4 = lVar1;
        __s1 = *(char **)((long)&commands[1].name + lVar4);
        if (lVar4 + 0x18 == 0xc0) {
          bVar5 = __s1 == (char *)0x0;
          iVar2 = 0;
          goto LAB_00106f30;
        }
        iVar2 = strcmp(__s1,__s2);
        lVar1 = lVar4 + 0x18;
      } while (iVar2 != 0);
      bVar5 = __s1 == (char *)0x0;
      pcVar3 = (command_t *)(lVar4 + 0x130fb8);
    }
    iVar2 = (*pcVar3->main)(argc,argv);
LAB_00106f30:
    if (!bVar5) {
      return iVar2;
    }
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[]) {
    if(argc < 2) {
        help_main(argc, argv);
        return EXIT_FAILURE;
    }
    for(int i = 0; commands[i].name != nullptr; ++i) {
        if(strcmp(commands[i].name, argv[1]) == 0) {
            return commands[i].main(argc, argv);
        }
    }
    fprintf(stderr,
            "ERROR: Command '%s' not found. Try '%s help' for a list of "
            "commands.\n",
            argv[1], argv[0]);
    return EXIT_FAILURE;
}